

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_clause.cpp
# Opt level: O2

unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> __thiscall
duckdb::AtClause::Copy(AtClause *this)

{
  pointer pPVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_20;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 1));
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_20,pPVar1);
  make_uniq<duckdb::AtClause,std::__cxx11::string_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((duckdb *)this,in_RSI,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_20);
  if (local_20._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)
         (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)this;
}

Assistant:

unique_ptr<AtClause> AtClause::Copy() const {
	return make_uniq<AtClause>(unit, expr->Copy());
}